

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[155],char_data*&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
          *func,char (*args) [155],char_data **args_1)

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  string *local_190;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_170 [40];
  string local_148 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_128;
  function<void()> local_110 [32];
  tuple<const_char_(&)[155],_char_data_*&> tuple;
  undefined1 local_e0 [176];
  
  nTimer_local = nTimer;
  local_190 = funcName;
  if (nTimer < 0) {
    local_e0._0_8_ =
         (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr
          *)0x2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_e0);
  }
  tuple.super__Tuple_impl<0UL,_const_char_(&)[155],_char_data_*&>.
  super__Tuple_impl<1UL,_char_data_*&>.super__Head_base<1UL,_char_data_*&,_false>._M_head_impl =
       (_Head_base<1UL,_char_data_*&,_false>)(_Head_base<1UL,_char_data_*&,_false>)args_1;
  tuple.super__Tuple_impl<0UL,_const_char_(&)[155],_char_data_*&>.
  super__Head_base<0UL,_const_char_(&)[155],_false>._M_head_impl = args;
  GetCharacterData<char_const(&)[155],char_data*&>(&chs,this,&tuple);
  local_170._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_170 + 8),(string *)from);
  std::__cxx11::string::string(local_148,(string *)local_190);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_128,&chs);
  local_e0._0_8_ = func;
  memcpy(local_e0 + 8,args,0x9b);
  local_e0._168_8_ = *args_1;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[155],char_data*&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(std::__cxx11::string,char_data*),char_const(&)[155],char_data*&)::_lambda()_1_,void>
            (local_110,(anon_class_176_3_3bdf3dc2 *)local_e0);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_170);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_170);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,local_190,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}